

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::DiskInterfaceTestReadFile::Run(DiskInterfaceTestReadFile *this)

{
  Test *pTVar1;
  FILE *__s;
  bool bVar2;
  Status SVar3;
  int iVar4;
  allocator<char> local_c1;
  string local_c0;
  char *local_a0;
  char *kTestContent;
  FILE *f;
  char *kTestFile;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string content;
  string err;
  DiskInterfaceTestReadFile *this_local;
  
  std::__cxx11::string::string((string *)(content.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foobar",&local_71);
  SVar3 = RealDiskInterface::ReadFile
                    (&(this->super_DiskInterfaceTest).disk_,&local_70,(string *)local_50,
                     (string *)((long)&content.field_2 + 8));
  bVar2 = testing::Test::Check
                    (pTVar1,SVar3 == NotFound,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                     ,0xaf,"DiskInterface::NotFound == disk_.ReadFile(\"foobar\", &content, &err)");
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0xb0,"\"\" == content");
    pTVar1 = g_current_test;
    bVar2 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&content.field_2 + 8));
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0xb1,"\"\" != err");
    std::__cxx11::string::clear();
    f = (FILE *)anon_var_dwarf_51c90;
    kTestContent = (char *)fopen("testfile","wb");
    bVar2 = testing::Test::Check
                      (g_current_test,(FILE *)kTestContent != (FILE *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                       ,0xb6,"f");
    if (bVar2) {
      local_a0 = "test content\nok";
      fprintf((FILE *)kTestContent,"%s","test content\nok");
      pTVar1 = g_current_test;
      iVar4 = fclose((FILE *)kTestContent);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                         ,0xb9,"0 == fclose(f)");
      __s = f;
      pTVar1 = g_current_test;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,(char *)__s,&local_c1);
        SVar3 = RealDiskInterface::ReadFile
                          (&(this->super_DiskInterfaceTest).disk_,&local_c0,(string *)local_50,
                           (string *)((long)&content.field_2 + 8));
        bVar2 = testing::Test::Check
                          (pTVar1,SVar3 == Okay,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                           ,0xbc,"DiskInterface::Okay == disk_.ReadFile(kTestFile, &content, &err)")
        ;
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        pTVar1 = g_current_test;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = std::operator==(local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_50);
          testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                     ,0xbd,"kTestContent == content");
          pTVar1 = g_current_test;
          bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&content.field_2 + 8));
          testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                     ,0xbe,"\"\" == err");
          kTestFile._0_4_ = 0;
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          kTestFile._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        kTestFile._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      kTestFile._0_4_ = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    kTestFile._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, ReadFile) {
  string err;
  std::string content;
  ASSERT_EQ(DiskInterface::NotFound,
            disk_.ReadFile("foobar", &content, &err));
  EXPECT_EQ("", content);
  EXPECT_NE("", err); // actual value is platform-specific
  err.clear();

  const char* kTestFile = "testfile";
  FILE* f = fopen(kTestFile, "wb");
  ASSERT_TRUE(f);
  const char* kTestContent = "test content\nok";
  fprintf(f, "%s", kTestContent);
  ASSERT_EQ(0, fclose(f));

  ASSERT_EQ(DiskInterface::Okay,
            disk_.ReadFile(kTestFile, &content, &err));
  EXPECT_EQ(kTestContent, content);
  EXPECT_EQ("", err);
}